

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Concatenate::backward_impl
          (Concatenate *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  size_type sVar1;
  long in_RDI;
  uint in_R8D;
  Dim *in_R9;
  uint begin;
  uint rows;
  MatrixBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  Index in_stack_ffffffffffffff60;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff68;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x50));
  if (in_R8D < sVar1) {
    Dim::rows(in_R9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x50),(ulong)in_R8D)
    ;
    Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::middleRows<unsigned_int>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    Tensor::operator*((Tensor *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator+=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    return;
  }
  __assert_fail("i < src_row_indices.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                ,0x47d,
                "virtual void cnn::Concatenate::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Concatenate::backward_impl(const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < src_row_indices.size());
  const unsigned rows = dEdxi.d.rows();
  const unsigned begin = src_row_indices[i];
#if HAVE_CUDA
  CUBLAS_CHECK(cublasSaxpy(cublas_handle, rows, kSCALAR_ONE, &dEdf.v[begin], 1, dEdxi.v, 1));
#else
  *dEdxi += (*dEdf).middleRows(begin, rows);
#endif
}